

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_minus(runtime_type *this,var *b)

{
  bool bVar1;
  type_info *this_00;
  numeric *pnVar2;
  runtime_error *this_01;
  any *in_RDX;
  allocator local_39;
  anon_union_16_2_310e9938_for_data local_38;
  undefined1 local_28;
  
  this_00 = cs_impl::any::type(in_RDX);
  bVar1 = std::type_info::operator==(this_00,(type_info *)&numeric::typeinfo);
  if (bVar1) {
    pnVar2 = cs_impl::any::const_val<cs::numeric>(in_RDX);
    bVar1 = pnVar2->type != true;
    if (bVar1) {
      local_38._0_10_ = -*(longdouble *)&pnVar2->data;
    }
    else {
      local_38._int = -(pnVar2->data)._int;
    }
    local_28 = !bVar1;
    cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_38);
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Unsupported operator operations(Minus).",&local_39);
  runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_minus(const var &b)
	{
		if (b.type() == typeid(numeric))
			return -b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Minus).");
	}